

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O1

UBool setCommonICUData(UDataMemory *pData,UBool warn,UErrorCode *pErr)

{
  UDataMemory *pUVar1;
  UBool extraout_AL;
  UBool extraout_AL_00;
  UDataMemory *dest;
  UDataMemory **ppUVar2;
  long lVar3;
  
  dest = UDataMemory_createNewInstance_63(pErr);
  if (U_ZERO_ERROR < *pErr) {
    return (UBool)dest;
  }
  UDatamemory_assign_63(dest,pData);
  lVar3 = 0;
  umtx_lock_63((UMutex *)0x0);
  ppUVar2 = gCommonICUDataArray;
  do {
    pUVar1 = *ppUVar2;
    if (pUVar1 == (UDataMemory *)0x0) {
      *ppUVar2 = dest;
      goto LAB_002acdc7;
    }
    if (pUVar1->pHeader == pData->pHeader) goto LAB_002acdc7;
    lVar3 = lVar3 + 1;
    ppUVar2 = ppUVar2 + 1;
  } while (lVar3 != 10);
  lVar3 = 10;
LAB_002acdc7:
  umtx_unlock_63((UMutex *)0x0);
  if (warn != '\0' && (int)lVar3 == 10) {
    *pErr = U_USING_DEFAULT_WARNING;
  }
  if (pUVar1 != (UDataMemory *)0x0) {
    uprv_free_63(dest);
    return extraout_AL;
  }
  ucln_common_registerCleanup_63(UCLN_COMMON_UDATA,udata_cleanup);
  return extraout_AL_00;
}

Assistant:

static UBool
setCommonICUData(UDataMemory *pData,     /*  The new common data.  Belongs to caller, we copy it. */
                 UBool       warn,       /*  If true, set USING_DEFAULT warning if ICUData was    */
                                         /*    changed by another thread before we got to it.     */
                 UErrorCode *pErr)
{
    UDataMemory  *newCommonData = UDataMemory_createNewInstance(pErr);
    int32_t i;
    UBool didUpdate = FALSE;
    if (U_FAILURE(*pErr)) {
        return FALSE;
    }

    /*  For the assignment, other threads must cleanly see either the old            */
    /*    or the new, not some partially initialized new.  The old can not be        */
    /*    deleted - someone may still have a pointer to it lying around in           */
    /*    their locals.                                                              */
    UDatamemory_assign(newCommonData, pData);
    umtx_lock(NULL);
    for (i = 0; i < UPRV_LENGTHOF(gCommonICUDataArray); ++i) {
        if (gCommonICUDataArray[i] == NULL) {
            gCommonICUDataArray[i] = newCommonData;
            didUpdate = TRUE;
            break;
        } else if (gCommonICUDataArray[i]->pHeader == pData->pHeader) {
            /* The same data pointer is already in the array. */
            break;
        }
    }
    umtx_unlock(NULL);

    if (i == UPRV_LENGTHOF(gCommonICUDataArray) && warn) {
        *pErr = U_USING_DEFAULT_WARNING;
    }
    if (didUpdate) {
        ucln_common_registerCleanup(UCLN_COMMON_UDATA, udata_cleanup);
    } else {
        uprv_free(newCommonData);
    }
    return didUpdate;
}